

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void check_initializer(c2m_ctx_t c2m_ctx,decl_t member_decl,type **type_ptr,
                      node_t_conflict initializer,int const_only_p,int top_p)

{
  node_code_t nVar1;
  undefined4 uVar2;
  type_mode tVar3;
  arr_type *paVar4;
  node_t_conflict pnVar5;
  size_t mark;
  VARR_init_object_t *pVVar6;
  byte *pbVar7;
  type *type;
  void *pvVar8;
  node_t pnVar9;
  undefined1 auVar10 [48];
  uint uVar11;
  int iVar12;
  node_t_conflict pnVar13;
  ulong uVar14;
  ulong uVar15;
  init_object_t *piVar16;
  type *ptVar17;
  char *pcVar18;
  mir_llong mVar19;
  mir_llong *max_index_00;
  long lVar20;
  node_t pnVar21;
  size_t sVar22;
  bool bVar23;
  bool bVar24;
  pos_t pVar25;
  mir_llong max_index;
  int addr_p;
  mir_llong offset;
  node_t_conflict base;
  node_t_conflict local_110;
  mir_llong local_100;
  type *local_f8;
  undefined4 local_f0;
  int local_ec;
  node_t local_e8;
  ulong local_e0;
  ulong local_d8;
  type **local_d0;
  node_t_conflict local_c8;
  pos_t local_c0;
  pos_t local_b0;
  pos_t local_a0;
  undefined4 local_90;
  undefined4 uStack_8c;
  node_t pnStack_88;
  node_t_conflict pnStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  symbol_t local_60;
  
  local_f8 = *type_ptr;
  local_ec = 0;
  local_d0 = type_ptr;
  pnVar13 = get_compound_literal(initializer,&local_ec);
  if (((pnVar13 != (node_t_conflict)0x0) && (local_ec == 0)) && (2 < initializer->code - N_STR)) {
    check_assignment_types
              (c2m_ctx,local_f8,(type *)0x0,(expr_conflict *)initializer->attr,initializer);
    initializer = (pnVar13->u).ops.head;
    if (initializer != (node_t)0x0) {
      initializer = (initializer->op_link).next;
    }
  }
  ptVar17 = local_f8;
  bVar24 = top_p == 0;
  do {
    bVar23 = bVar24;
    nVar1 = initializer->code;
    if ((nVar1 != N_LIST) &&
       ((ptVar17->mode != TM_ARR ||
        (iVar12 = init_compatible_string_p(initializer,((ptVar17->u).ptr_type)->arr_type),
        iVar12 == 0)))) {
      if (((nVar1 - N_STR < 2) ||
          ((undefined1  [64])
           ((undefined1  [64])*(expr_conflict *)initializer->attr & (undefined1  [64])0x1) !=
           (undefined1  [64])0x0)) || ((const_only_p == 0 || (nVar1 == N_STR32)))) {
        check_assignment_types
                  (c2m_ctx,ptVar17,(type *)0x0,(expr_conflict *)initializer->attr,initializer);
        return;
      }
      iVar12 = check_const_addr_p(c2m_ctx,initializer,(node_t_conflict *)&local_60,
                                  (mir_llong *)&local_90,(int *)&local_100);
      if ((iVar12 != 0) && ((int)local_100 == 0)) {
        pbVar7 = (byte *)initializer->attr;
        *pbVar7 = *pbVar7 | 2;
        *(undefined8 *)(pbVar7 + 0x10) = local_60._0_8_;
        *(ulong *)(pbVar7 + 0x30) = CONCAT44(uStack_8c,local_90);
      }
      if (((undefined1  [64])
           ((undefined1  [64])*(expr_conflict *)initializer->attr & (undefined1  [64])0x2) ==
           (undefined1  [64])0x0) && ((pnVar13 == (node_t_conflict)0x0 || (local_ec == 0)))) {
        pVar25 = get_node_pos(c2m_ctx,initializer);
        error(c2m_ctx,0x1c107d,pVar25.fname,pVar25._8_8_);
        return;
      }
      check_assignment_types
                (c2m_ctx,ptVar17,(type *)0x0,(expr_conflict *)initializer->attr,initializer);
      return;
    }
    local_110 = (initializer->u).ops.head;
    pnVar21 = initializer;
    if (2 < nVar1 - N_STR) {
      if (local_110 != (node_t_conflict)0x0) {
        if (((local_110->code == N_INIT) && ((local_110->op_link).next == (node_t)0x0)) &&
           ((pnVar21 = (local_110->u).ops.head, pnVar21->code == N_LIST &&
            ((((pnVar21->u).s.s == (char *)0x0 &&
              (pnVar21 = (pnVar21->op_link).next, pnVar21 != (node_t)0x0)) &&
             (pnVar21->code - N_STR < 3)))))) goto LAB_0018581b;
        goto LAB_00185865;
      }
LAB_001858df:
      iVar12 = scalar_type_p(ptVar17);
      if (iVar12 == 0) {
        return;
      }
      pVar25 = get_node_pos(c2m_ctx,initializer);
      pcVar18 = "empty scalar initializer";
      goto LAB_00185a3d;
    }
LAB_0018581b:
    if (ptVar17->mode == TM_ARR) {
      paVar4 = (ptVar17->u).arr_type;
      iVar12 = init_compatible_string_p(pnVar21,paVar4->el_type);
      if (iVar12 != 0) {
        pcVar18 = (char *)(pnVar21->u).s.len;
        iVar12 = incomplete_type_p(c2m_ctx,ptVar17);
        if (iVar12 != 0) {
          if ((char *)0x7ffffffe < pcVar18) {
            __assert_fail("len < MIR_INT_MAX",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x1e1c,
                          "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                         );
          }
          pVar25 = get_node_pos(c2m_ctx,paVar4->size);
          pnVar13 = new_node(c2m_ctx,N_I);
          add_pos(c2m_ctx,pnVar13,pVar25);
          (pnVar13->u).s.s = pcVar18;
          ((ptVar17->u).arr_type)->size = pnVar13;
          check(c2m_ctx,((ptVar17->u).arr_type)->size,(node_t_conflict)0x0);
          make_type_complete(c2m_ctx,ptVar17);
          return;
        }
        if (pcVar18 <= (char *)(*(long *)((long)paVar4->size->attr + 0x30) + 1)) {
          return;
        }
        pVar25 = get_node_pos(c2m_ctx,initializer);
        pcVar18 = "string is too long for array initializer";
        goto LAB_00185a3d;
      }
    }
LAB_00185865:
    if (local_110 == (node_t_conflict)0x0) goto LAB_001858df;
    if (local_110->code != N_INIT) {
      __assert_fail("init->code == N_INIT",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1e29,
                    "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    pnVar21 = (local_110->u).ops.head;
    if (pnVar21->code != N_LIST) {
      __assert_fail("des_list->code == N_LIST",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1e2b,
                    "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    if (ptVar17->mode - TM_STRUCT < 3) {
      if (c2m_ctx->init_object_path == (VARR_init_object_t *)0x0) goto LAB_00186315;
      mark = c2m_ctx->init_object_path->els_num;
      if (ptVar17->mode == TM_ARR) {
        uVar14 = get_arr_type_size(ptVar17);
        uVar14 = uVar14 >> 0x3f;
        mVar19 = -1;
      }
      else {
        mVar19 = 0;
        uVar14 = 0;
      }
      pVVar6 = c2m_ctx->init_object_path;
      if (pVVar6->varr == (init_object_t *)0x0) goto LAB_0018631a;
      uVar15 = pVVar6->els_num + 1;
      local_d8 = uVar14;
      if (pVVar6->size < uVar15) {
        sVar22 = (uVar15 >> 1) + uVar15;
        piVar16 = (init_object_t *)realloc(pVVar6->varr,sVar22 * 0x18);
        pVVar6->varr = piVar16;
        pVVar6->size = sVar22;
      }
      sVar22 = pVVar6->els_num;
      piVar16 = pVVar6->varr;
      pVVar6->els_num = sVar22 + 1;
      piVar16[sVar22].container_type = ptVar17;
      piVar16[sVar22].field_designator_p = 0;
      piVar16[sVar22].u.curr_index = mVar19;
      local_100 = -1;
      local_e0 = mark + 1;
      break;
    }
    pnVar5 = (local_110->op_link).next;
    if (pnVar5 != (node_t_conflict)0x0) {
      pVar25 = get_node_pos(c2m_ctx,pnVar5);
      pcVar18 = "excess elements in scalar initializer";
      goto LAB_00185a3d;
    }
    pnVar5 = (pnVar21->u).ops.head;
    if (pnVar5 != (node_t_conflict)0x0) {
      pVar25 = get_node_pos(c2m_ctx,pnVar5);
      pcVar18 = "designator in scalar initializer";
      goto LAB_00185a3d;
    }
    initializer = (pnVar21->op_link).next;
    bVar24 = true;
    if (bVar23) {
      pVar25 = get_node_pos(c2m_ctx,local_110);
      pcVar18 = "braces around scalar initializer";
LAB_00185a3d:
      error(c2m_ctx,pcVar18,pVar25.fname,pVar25._8_8_);
      return;
    }
  } while( true );
  do {
    if (local_110->code != N_INIT) {
LAB_001862ec:
      __assert_fail("init->code == N_INIT",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1e49,
                    "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    pnVar21 = (local_110->u).ops.head;
    local_e8 = (pnVar21->op_link).next;
    if (((local_e8->code == N_LIST) || (local_e8->code == N_COMPOUND_LITERAL)) &&
       (2 < local_f8->mode - TM_STRUCT)) {
      pVar25 = get_node_pos(c2m_ctx,local_110);
      pcVar18 = "compound literal for scalar initializer";
      if (local_e8->code == N_LIST) {
        pcVar18 = "braces around scalar initializer";
      }
      error(c2m_ctx,pcVar18,pVar25.fname,pVar25._8_8_);
      break;
    }
    pnVar13 = (pnVar21->u).ops.head;
    if (pnVar13 == (node_t_conflict)0x0) {
      local_a0 = get_node_pos(c2m_ctx,local_110);
      iVar12 = update_path_and_do(c2m_ctx,1,check_initializer,mark,local_e8,const_only_p,&local_100,
                                  local_a0,"array/struct/union");
      if (iVar12 == 0) break;
    }
    else {
      pVVar6 = c2m_ctx->init_object_path;
      if (((pVVar6 == (VARR_init_object_t *)0x0) || (pVVar6->varr == (init_object_t *)0x0)) ||
         (pVVar6->els_num < local_e0)) {
        check_initializer_cold_3();
        goto LAB_001862ec;
      }
      pVVar6->els_num = local_e0;
      bVar24 = false;
      ptVar17 = local_f8;
      do {
        pVVar6 = c2m_ctx->init_object_path;
        if (((pVVar6 == (VARR_init_object_t *)0x0) ||
            (piVar16 = pVVar6->varr, piVar16 == (init_object_t *)0x0)) ||
           (sVar22 = pVVar6->els_num, sVar22 == 0)) {
          check_initializer_cold_2();
LAB_0018628a:
          __assert_fail("init_object.container_type->mode == TM_STRUCT || init_object.container_type->mode == TM_UNION"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x1e66,
                        "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                       );
        }
        uVar2 = *(undefined4 *)&piVar16[sVar22 - 1].field_0xc;
        if (bVar24) {
          tVar3 = (piVar16[sVar22 - 1].container_type)->mode;
          if (tVar3 - TM_STRUCT < 2) {
            ptVar17 = *(type **)((long)(piVar16[sVar22 - 1].u.curr_member)->attr + 0x40);
          }
          else {
            if (tVar3 != TM_ARR) goto LAB_0018628a;
            ptVar17 = (((piVar16[sVar22 - 1].container_type)->u).ptr_type)->arr_type;
          }
        }
        else {
          pVVar6->els_num = sVar22 - 1;
        }
        if (pnVar13->code == N_FIELD_ID) {
          if ((ptVar17->mode & ~TM_BASIC) == TM_STRUCT) {
            pnVar21 = (pnVar13->u).ops.head;
            pnStack_80 = (ptVar17->u).tag_type;
            local_90 = 0;
            auVar10._4_8_ = pnVar21;
            auVar10._0_4_ = uStack_8c;
            auVar10._12_8_ = pnStack_80;
            auVar10._20_8_ = uStack_78;
            auVar10._28_8_ = uStack_70;
            auVar10._36_8_ = uStack_68;
            auVar10._44_4_ = 0;
            pnStack_88 = pnVar21;
            iVar12 = HTAB_symbol_t_do(c2m_ctx->symbol_tab,(symbol_t)(auVar10 << 0x20),HTAB_FIND,
                                      &local_60);
            if (iVar12 == 0) {
              pVar25 = get_node_pos(c2m_ctx,pnVar13);
              error(c2m_ctx,0x1c12d4,pVar25.fname,pVar25._8_8_,(pnVar21->u).s.s);
              goto LAB_00185d9c;
            }
            local_c8 = local_60.def_node;
            process_init_field_designator(c2m_ctx,local_60.def_node,ptVar17);
            pnVar21 = (pnVar13->op_link).next;
            local_b0 = get_node_pos(c2m_ctx,local_110);
            iVar12 = update_path_and_do(c2m_ctx,(uint)(pnVar21 == (node_t)0x0),check_initializer,
                                        mark,local_e8,const_only_p,(mir_llong *)0x0,local_b0,
                                        "struct/union");
            bVar24 = iVar12 != 0;
          }
          else {
            pVar25 = get_node_pos(c2m_ctx,pnVar13);
            error(c2m_ctx,0x1c12a6,pVar25.fname,pVar25._8_8_);
LAB_00185d9c:
            bVar24 = true;
          }
          if (!bVar24) break;
        }
        else {
          pcVar18 = "array index in initializer for non-array";
          if (ptVar17->mode == TM_ARR) {
            pbVar7 = (byte *)pnVar13->attr;
            pcVar18 = "nonconstant array index in initializer";
            if ((*pbVar7 & 1) == 0) goto LAB_00185f1c;
            type = *(type **)(pbVar7 + 0x18);
            if (type->mode == TM_BASIC) {
              bVar23 = (type->u).basic_type - TP_BOOL < 0xc;
            }
            else {
              bVar23 = false;
            }
            if (((type->mode != TM_ENUM) &&
                (pcVar18 = "array index in initializer not of integer type", !bVar23)) ||
               (((local_f0 = uVar2, iVar12 = incomplete_type_p(c2m_ctx,ptVar17), iVar12 != 0 &&
                 ((iVar12 = signed_integer_type_p(type), iVar12 != 0 &&
                  (pcVar18 = "negative array index in initializer for array without size",
                  *(long *)(pbVar7 + 0x30) < 0)))) ||
                ((uVar14 = get_arr_type_size(ptVar17), -1 < (long)uVar14 &&
                 (pcVar18 = "array index in initializer exceeds array bounds",
                 uVar14 <= *(ulong *)(pbVar7 + 0x30))))))) goto LAB_00185f1c;
            pVVar6 = c2m_ctx->init_object_path;
            if (pVVar6->varr == (init_object_t *)0x0) {
              check_initializer_cold_1();
              goto LAB_00186310;
            }
            lVar20 = *(long *)(pbVar7 + 0x30);
            uVar14 = pVVar6->els_num + 1;
            if (pVVar6->size < uVar14) {
              sVar22 = (uVar14 >> 1) + uVar14;
              piVar16 = (init_object_t *)realloc(pVVar6->varr,sVar22 * 0x18);
              pVVar6->varr = piVar16;
              pVVar6->size = sVar22;
            }
            sVar22 = pVVar6->els_num;
            piVar16 = pVVar6->varr;
            pVVar6->els_num = sVar22 + 1;
            piVar16[sVar22].container_type = ptVar17;
            piVar16[sVar22].field_designator_p = 0;
            *(undefined4 *)&piVar16[sVar22].field_0xc = local_f0;
            piVar16[sVar22].u.curr_member = (node_t_conflict)(lVar20 + -1);
            pnVar21 = (pnVar13->op_link).next;
            max_index_00 = &local_100;
            if (bVar24) {
              max_index_00 = (mir_llong *)0x0;
            }
            local_c0 = get_node_pos(c2m_ctx,local_110);
            iVar12 = update_path_and_do(c2m_ctx,(uint)(pnVar21 == (node_t)0x0),check_initializer,
                                        mark,local_e8,const_only_p,max_index_00,local_c0,"array");
            if (iVar12 == 0) break;
          }
          else {
LAB_00185f1c:
            pVar25 = get_node_pos(c2m_ctx,pnVar13);
            error(c2m_ctx,pcVar18,pVar25.fname,pVar25._8_8_);
          }
        }
        pnVar13 = (pnVar13->op_link).next;
        bVar24 = true;
      } while (pnVar13 != (node_t)0x0);
    }
    local_110 = (local_110->op_link).next;
  } while (local_110 != (node_t)0x0);
  ptVar17 = local_f8;
  if (((local_f8->mode == TM_ARR & (byte)local_d8) == 1) && (-1 < local_100)) {
    pnVar13 = (node_t_conflict)reg_malloc(c2m_ctx,0x20);
    ptVar17 = create_type(c2m_ctx,ptVar17);
    iVar12 = incomplete_type_p(c2m_ctx,ptVar17);
    if (iVar12 == 0) goto LAB_0018631f;
    pnVar5 = (ptVar17->u).tag_type;
    uVar11 = pnVar5->uid;
    pvVar8 = pnVar5->attr;
    pnVar21 = (pnVar5->op_link).prev;
    pnVar9 = (pnVar5->op_link).next;
    pnVar13->code = pnVar5->code;
    pnVar13->uid = uVar11;
    pnVar13->attr = pvVar8;
    (pnVar13->op_link).prev = pnVar21;
    (pnVar13->op_link).next = pnVar9;
    (ptVar17->u).tag_type = pnVar13;
    pnVar13 = (pnVar13->op_link).next;
    if (local_100 < 0x7fffffff) {
      pcVar18 = (char *)(local_100 + 1);
      pVar25 = get_node_pos(c2m_ctx,pnVar13);
      pnVar13 = new_node(c2m_ctx,N_I);
      add_pos(c2m_ctx,pnVar13,pVar25);
      (pnVar13->u).s.s = pcVar18;
    }
    else if (local_100 == 0x7fffffffffffffff) {
      pVar25 = get_node_pos(c2m_ctx,pnVar13);
      pnVar13 = new_ll_node(c2m_ctx,-0x8000000000000000,pVar25);
    }
    else {
      lVar20 = local_100 + 1;
      pVar25 = get_node_pos(c2m_ctx,pnVar13);
      pnVar13 = new_l_node(c2m_ctx,lVar20,pVar25);
    }
    ((ptVar17->u).arr_type)->size = pnVar13;
    check(c2m_ctx,((ptVar17->u).arr_type)->size,(node_t_conflict)0x0);
    make_type_complete(c2m_ctx,ptVar17);
  }
  pVVar6 = c2m_ctx->init_object_path;
  if (((pVVar6 != (VARR_init_object_t *)0x0) && (pVVar6->varr != (init_object_t *)0x0)) &&
     (mark <= pVVar6->els_num)) {
    pVVar6->els_num = mark;
    *local_d0 = ptVar17;
    return;
  }
LAB_00186310:
  check_initializer_cold_4();
LAB_00186315:
  check_initializer_cold_6();
LAB_0018631a:
  check_initializer_cold_5();
LAB_0018631f:
  __assert_fail("incomplete_type_p (c2m_ctx, type)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x1e9a,
                "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
}

Assistant:

static void check_initializer (c2m_ctx_t c2m_ctx, decl_t member_decl MIR_UNUSED,
                               struct type **type_ptr, node_t initializer, int const_only_p,
                               int top_p) {
  struct type *type = *type_ptr;
  struct expr *cexpr;
  node_t literal, des_list, curr_des, init, str, value, size_node, temp;
  mir_llong max_index;
  mir_llong size_val = 0; /* to remove an uninitialized warning */
  size_t mark, len;
  symbol_t sym;
  init_object_t init_object;
  int addr_p = FALSE; /* to remove an uninitialized warning */

  literal = get_compound_literal (initializer, &addr_p);
  if (literal != NULL && !addr_p && initializer->code != N_STR && initializer->code != N_STR16
      && initializer->code != N_STR32) {
    cexpr = initializer->attr;
    check_assignment_types (c2m_ctx, type, NULL, cexpr, initializer);
    initializer = NL_EL (literal->u.ops, 1);
  }
check_one_value:
  if (initializer->code != N_LIST
      && !(type->mode == TM_ARR
           && init_compatible_string_p (initializer, type->u.arr_type->el_type))) {
    if ((cexpr = initializer->attr)->const_p || initializer->code == N_STR
        || initializer->code == N_STR16 || initializer->code == N_STR32 || !const_only_p) {
      check_assignment_types (c2m_ctx, type, NULL, cexpr, initializer);
    } else {
      setup_const_addr_p (c2m_ctx, initializer);
      if ((cexpr = initializer->attr)->const_addr_p || (literal != NULL && addr_p))
        check_assignment_types (c2m_ctx, type, NULL, cexpr, initializer);
      else
        error (c2m_ctx, POS (initializer),
               "initializer of non-auto or thread local object"
               " should be a constant expression or address");
    }
    return;
  }
  init = NL_HEAD (initializer->u.ops);
  if (((str = initializer)->code == N_STR || str->code == N_STR16
       || str->code == N_STR32 /* string or string in parentheses */
       || (init != NULL && init->code == N_INIT && NL_EL (initializer->u.ops, 1) == NULL
           && (des_list = NL_HEAD (init->u.ops))->code == N_LIST
           && NL_HEAD (des_list->u.ops) == NULL && NL_EL (init->u.ops, 1) != NULL
           && ((str = NL_EL (init->u.ops, 1))->code == N_STR || str->code == N_STR16
               || str->code == N_STR32)))
      && type->mode == TM_ARR && init_compatible_string_p (str, type->u.arr_type->el_type)) {
    len = str->u.s.len;
    if (incomplete_type_p (c2m_ctx, type)) {
      assert (len < MIR_INT_MAX);
      type->u.arr_type->size = new_i_node (c2m_ctx, (long) len, POS (type->u.arr_type->size));
      check (c2m_ctx, type->u.arr_type->size, NULL);
      make_type_complete (c2m_ctx, type);
    } else if (len > (size_t) ((struct expr *) type->u.arr_type->size->attr)->c.i_val + 1) {
      error (c2m_ctx, POS (initializer), "string is too long for array initializer");
    }
    return;
  }
  if (init == NULL) {
    if (scalar_type_p (type)) error (c2m_ctx, POS (initializer), "empty scalar initializer");
    return;
  }
  assert (init->code == N_INIT);
  des_list = NL_HEAD (init->u.ops);
  assert (des_list->code == N_LIST);
  if (type->mode != TM_ARR && type->mode != TM_STRUCT && type->mode != TM_UNION) {
    if ((temp = NL_NEXT (init)) != NULL) {
      error (c2m_ctx, POS (temp), "excess elements in scalar initializer");
      return;
    }
    if ((temp = NL_HEAD (des_list->u.ops)) != NULL) {
      error (c2m_ctx, POS (temp), "designator in scalar initializer");
      return;
    }
    initializer = NL_NEXT (des_list);
    if (!top_p) {
      error (c2m_ctx, POS (init), "braces around scalar initializer");
      return;
    }
    top_p = FALSE;
    goto check_one_value;
  }
  mark = VARR_LENGTH (init_object_t, init_object_path);
  init_object.container_type = type;
  init_object.field_designator_p = FALSE;
  if (type->mode == TM_ARR) {
    size_val = get_arr_type_size (type);
    init_object.u.curr_index = -1;
  } else {
    init_object.u.curr_member = NULL;
  }
  VARR_PUSH (init_object_t, init_object_path, init_object);
  max_index = -1;
  for (; init != NULL; init = NL_NEXT (init)) {
    assert (init->code == N_INIT);
    des_list = NL_HEAD (init->u.ops);
    value = NL_NEXT (des_list);
    if ((value->code == N_LIST || value->code == N_COMPOUND_LITERAL) && type->mode != TM_ARR
        && type->mode != TM_STRUCT && type->mode != TM_UNION) {
      error (c2m_ctx, POS (init),
             value->code == N_LIST ? "braces around scalar initializer"
                                   : "compound literal for scalar initializer");
      break;
    }
    if ((curr_des = NL_HEAD (des_list->u.ops)) == NULL) {
      if (!update_path_and_do (c2m_ctx, TRUE, check_initializer, mark, value, const_only_p,
                               &max_index, POS (init), "array/struct/union"))
        break;
    } else {
      struct type *curr_type = type;
      mir_llong arr_size_val MIR_UNUSED;
      int first_p = TRUE;

      VARR_TRUNC (init_object_t, init_object_path, mark + 1);
      for (; curr_des != NULL; curr_des = NL_NEXT (curr_des), first_p = FALSE) {
        init_object = VARR_LAST (init_object_t, init_object_path);
        if (first_p) {
          VARR_POP (init_object_t, init_object_path);
        } else {
          if (init_object.container_type->mode == TM_ARR) {
            curr_type = init_object.container_type->u.arr_type->el_type;
          } else {
            assert (init_object.container_type->mode == TM_STRUCT
                    || init_object.container_type->mode == TM_UNION);
            decl_t el_decl = init_object.u.curr_member->attr;
            curr_type = el_decl->decl_spec.type;
          }
        }
        if (curr_des->code == N_FIELD_ID) {
          node_t id = NL_HEAD (curr_des->u.ops);

          if (curr_type->mode != TM_STRUCT && curr_type->mode != TM_UNION) {
            error (c2m_ctx, POS (curr_des), "field name not in struct or union initializer");
          } else if (!symbol_find (c2m_ctx, S_REGULAR, id, curr_type->u.tag_type, &sym)) {
            error (c2m_ctx, POS (curr_des), "unknown field %s in initializer", id->u.s.s);
          } else {
            process_init_field_designator (c2m_ctx, sym.def_node, curr_type);
            if (!update_path_and_do (c2m_ctx, NL_NEXT (curr_des) == NULL, check_initializer, mark,
                                     value, const_only_p, NULL, POS (init), "struct/union"))
              break;
          }
        } else if (curr_type->mode != TM_ARR) {
          error (c2m_ctx, POS (curr_des), "array index in initializer for non-array");
        } else if (!(cexpr = curr_des->attr)->const_p) {
          error (c2m_ctx, POS (curr_des), "nonconstant array index in initializer");
        } else if (!integer_type_p (cexpr->type)) {
          error (c2m_ctx, POS (curr_des), "array index in initializer not of integer type");
        } else if (incomplete_type_p (c2m_ctx, curr_type) && signed_integer_type_p (cexpr->type)
                   && cexpr->c.i_val < 0) {
          error (c2m_ctx, POS (curr_des),
                 "negative array index in initializer for array without size");
        } else if ((arr_size_val = get_arr_type_size (curr_type)) >= 0
                   && (mir_ullong) arr_size_val <= cexpr->c.u_val) {
          error (c2m_ctx, POS (curr_des), "array index in initializer exceeds array bounds");
        } else {
          init_object.u.curr_index = cexpr->c.i_val - 1; /* previous el */
          init_object.field_designator_p = FALSE;
          init_object.container_type = curr_type;
          VARR_PUSH (init_object_t, init_object_path, init_object);
          if (!update_path_and_do (c2m_ctx, NL_NEXT (curr_des) == NULL, check_initializer, mark,
                                   value, const_only_p, first_p ? &max_index : NULL, POS (init),
                                   "array"))
            break;
        }
      }
    }
  }
  if (type->mode == TM_ARR && size_val < 0 && max_index >= 0) {
    /* Array w/o size: define it.  Copy the type as the incomplete
       type can be shared by declarations with different length
       initializers.  We need only one level of copying as sub-array
       can not have incomplete type with an initializer. */
    struct arr_type *arr_type = reg_malloc (c2m_ctx, sizeof (struct arr_type));

    type = create_type (c2m_ctx, type);
    assert (incomplete_type_p (c2m_ctx, type));
    *arr_type = *type->u.arr_type;
    type->u.arr_type = arr_type;
    size_node = type->u.arr_type->size;
    type->u.arr_type->size
      = (max_index < MIR_INT_MAX    ? new_i_node (c2m_ctx, (long) max_index + 1, POS (size_node))
         : max_index < MIR_LONG_MAX ? new_l_node (c2m_ctx, (long) max_index + 1, POS (size_node))
                                    : new_ll_node (c2m_ctx, max_index + 1, POS (size_node)));
    check (c2m_ctx, type->u.arr_type->size, NULL);
    make_type_complete (c2m_ctx, type);
  }
  VARR_TRUNC (init_object_t, init_object_path, mark);
  *type_ptr = type;
  return;
}